

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLVector3.cpp
# Opt level: O2

ostream * AML::operator<<(ostream *os,Vector3 *obj)

{
  ostream *poVar1;
  
  std::operator<<(os,"[");
  poVar1 = std::ostream::_M_insert<double>((obj->field_0).data[0]);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>((obj->field_0).data[1]);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>((obj->field_0).data[2]);
  std::operator<<(poVar1,"]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Vector3& obj)
    {
        os << "[" << obj.x << ", " << obj.y << ", " << obj.z << "]";
        return os;
    }